

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManComputeCutLi(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  
  if (p->nTruePos == 0) {
    p_00 = Vec_PtrAlloc(100);
    Aig_ManIncrementTravId(p);
    for (iVar3 = 0; iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar3);
      pObj = (Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
      iVar1 = Aig_ObjIsConst1(pObj);
      if ((iVar1 == 0) && (pObj->TravId != p->nTravIds)) {
        pObj->TravId = p->nTravIds;
        Vec_PtrPush(p_00,pObj);
      }
    }
    return p_00;
  }
  __assert_fail("Saig_ManPoNum(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                ,0x44e,"Vec_Ptr_t *Llb_ManComputeCutLi(Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLi( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManPoNum(p) == 0 );
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId(p);
    Saig_ManForEachLi( p, pObj, i )
    {
        pObj = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        Aig_ObjSetTravIdCurrent(p, pObj);
        Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}